

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationFederate.cpp
# Opt level: O0

string * __thiscall
helics::CombinationFederate::localQuery_abi_cxx11_(CombinationFederate *this,string_view queryStr)

{
  string_view queryStr_00;
  string_view queryStr_01;
  bool bVar1;
  char *in_RDX;
  string *in_RDI;
  string *res;
  MessageFederate *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  queryStr_00._M_str = in_stack_ffffffffffffff98;
  queryStr_00._M_len = in_stack_ffffffffffffff90;
  helics::ValueFederate::localQuery_abi_cxx11_
            ((ValueFederate *)in_stack_ffffffffffffff88,queryStr_00);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x250c43);
  if (bVar1) {
    queryStr_01._M_str = in_RDX;
    queryStr_01._M_len = in_stack_ffffffffffffff90;
    helics::MessageFederate::localQuery_abi_cxx11_(in_stack_ffffffffffffff88,queryStr_01);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CombinationFederate::localQuery(std::string_view queryStr) const
{
    std::string res = ValueFederate::localQuery(queryStr);
    if (res.empty()) {
        res = MessageFederate::localQuery(queryStr);
    }
    return res;
}